

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::internal::RepeatedFieldAccessor::Get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,RepeatedFieldAccessor *this,Field *data,int index)

{
  int iVar1;
  undefined4 extraout_var;
  string local_48 [8];
  ActualType scratch_space;
  int index_local;
  Field *data_local;
  RepeatedFieldAccessor *this_local;
  
  scratch_space.field_2._12_4_ = index;
  std::__cxx11::string::string(local_48);
  iVar1 = (*this->_vptr_RepeatedFieldAccessor[4])
                    (this,data,(ulong)(uint)scratch_space.field_2._12_4_,local_48);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)CONCAT44(extraout_var,iVar1));
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

T Get(const Field* data, int index) const {
    typedef typename RefTypeTraits<T>::AccessorValueType ActualType;
    ActualType scratch_space;
    return static_cast<T>(
        *reinterpret_cast<const ActualType*>(
            Get(data, index, static_cast<Value*>(&scratch_space))));
  }